

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O1

void __thiscall
QPDFArgParser::addChoicesToCompletions
          (QPDFArgParser *this,option_table_t *option_table,string *option,string *extra_prefix)

{
  element_type *peVar1;
  const_iterator cVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
          ::find(&option_table->_M_t,option);
  if ((_Rb_tree_header *)cVar2._M_node != &(option_table->_M_t)._M_impl.super__Rb_tree_header) {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::OptionEntry>_>_>
             ::operator[](option_table,option);
    p_Var4 = (pmVar3->choices)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var5 = &(pmVar3->choices)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var5) {
      do {
        peVar1 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        std::operator+(&local_50,extra_prefix,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var4 + 1));
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&peVar1->completions,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var5);
    }
  }
  return;
}

Assistant:

void
QPDFArgParser::addChoicesToCompletions(
    option_table_t& option_table, std::string const& option, std::string const& extra_prefix)
{
    if (option_table.count(option) != 0) {
        OptionEntry& oe = option_table[option];
        for (auto const& choice: oe.choices) {
            QTC::TC("libtests", "QPDFArgParser complete choices");
            m->completions.insert(extra_prefix + choice);
        }
    }
}